

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.h
# Opt level: O2

void gimage::getBoxMuller(double *ret1,double *ret2,double stddev)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  do {
    do {
      iVar1 = rand();
      dVar4 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
      iVar1 = rand();
      dVar5 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
      dVar2 = dVar4 * dVar4 + dVar5 * dVar5;
    } while (dVar2 == 0.0);
  } while (1.0 <= dVar2);
  dVar3 = log(dVar2);
  dVar2 = (dVar3 * -2.0) / dVar2;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  *ret1 = dVar4 * dVar2 * stddev;
  *ret2 = dVar5 * dVar2 * stddev;
  return;
}

Assistant:

inline void getBoxMuller(double &ret1, double &ret2, double stddev)
{
  double u, v, s;

  do
  {
    u=(2.0*rand())/RAND_MAX-1.0;
    v=(2.0*rand())/RAND_MAX-1.0;
    s=u*u+v*v;
  }
  while (s == 0 || s >= 1.0);

  s=sqrt(-2.0*log(s)/s);

  ret1=u*s*stddev;
  ret2=v*s*stddev;
}